

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O2

void __thiscall
Js::JavascriptPromiseAllSettledResolveOrRejectElementFunction::
JavascriptPromiseAllSettledResolveOrRejectElementFunction
          (JavascriptPromiseAllSettledResolveOrRejectElementFunction *this,DynamicType *type)

{
  JavascriptPromiseAllResolveElementFunction::JavascriptPromiseAllResolveElementFunction
            (&this->super_JavascriptPromiseAllResolveElementFunction,type);
  (this->super_JavascriptPromiseAllResolveElementFunction).super_RuntimeFunction.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject = (IRecyclerVisitedObject)&PTR_Finalize_013cabe8;
  (this->alreadyCalledWrapper).ptr =
       (JavascriptPromiseResolveOrRejectFunctionAlreadyResolvedWrapper *)0x0;
  this->isRejecting = false;
  return;
}

Assistant:

JavascriptPromiseAllSettledResolveOrRejectElementFunction::JavascriptPromiseAllSettledResolveOrRejectElementFunction(DynamicType* type)
        : JavascriptPromiseAllResolveElementFunction(type), alreadyCalledWrapper(nullptr), isRejecting(false)
    { }